

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * memManager(VM *vm,void *ptr,uint32_t oldSize,uint32_t newSize)

{
  uint32_t newSize_local;
  uint32_t oldSize_local;
  void *ptr_local;
  VM *vm_local;
  
  vm->allocatedBytes = (newSize - oldSize) + vm->allocatedBytes;
  if (newSize == 0) {
    free(ptr);
    vm_local = (VM *)0x0;
  }
  else {
    vm_local = (VM *)realloc(ptr,(ulong)newSize);
  }
  return vm_local;
}

Assistant:

void *memManager(VM *vm, void *ptr, uint32_t oldSize, uint32_t newSize) {
    vm->allocatedBytes += newSize - oldSize;

    //避免realloc(NULL, 0)定义的新地址,此地址不能被释放
    if (newSize == 0) {
        free(ptr);
        return NULL;
    }

    return realloc(ptr, newSize);
}